

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

bool FastPForLib::Simple16<false>::trymefull<7u,1u,7u,2u,7u,1u>(uint32_t *n)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  do {
    if (1 < n[lVar1]) {
      return false;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  lVar1 = 0;
  do {
    if (3 < n[lVar1 + 7]) {
      return false;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  uVar2 = 0xd;
  do {
    if (1 < n[uVar2 + 1]) {
      return false;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x14);
  return 0x13 < uVar2;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    const uint32_t min3 = num3;
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if (n[i] >= (1U << log3))
        return false;
    }
    return true;
  }